

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void main_loop(GPU_Target *screen)

{
  int iVar1;
  int local_50 [2];
  SDL_Event event;
  GPU_Target *pGStack_10;
  Uint8 done;
  GPU_Target *screen_local;
  
  event.padding[0x37] = '\0';
  pGStack_10 = screen;
  while (event.padding[0x37] == '\0') {
    while (iVar1 = SDL_PollEvent(local_50), iVar1 != 0) {
      if (local_50[0] == 0x100) {
        event.padding[0x37] = '\x01';
      }
      else if ((local_50[0] == 0x300) && (event.motion.which == 0x1b)) {
        event.padding[0x37] = '\x01';
      }
    }
    GPU_Clear(pGStack_10);
    GPU_Flip(pGStack_10);
  }
  return;
}

Assistant:

void main_loop(GPU_Target* screen)
{
    Uint8 done;
    SDL_Event event;
    
    done = 0;
    while(!done)
    {
        while(SDL_PollEvent(&event))
        {
            if(event.type == SDL_QUIT)
                done = 1;
            else if(event.type == SDL_KEYDOWN)
            {
                if(event.key.keysym.sym == SDLK_ESCAPE)
                    done = 1;
            }
        }
        
        // Update logic here
        
        GPU_Clear(screen);
        
        // Draw stuff here
        
        GPU_Flip(screen);
    }
}